

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O3

void Abc_NtkDropOneOutput(Abc_Ntk_t *pNtk,int iOutput,int fSkipSweep,int fUseConst1)

{
  Abc_Obj_t *pObj;
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *pAVar2;
  ulong uVar3;
  
  if ((iOutput < 0) || (pNtk->vPos->nSize <= iOutput)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pObj = (Abc_Obj_t *)pNtk->vPos->pArray[(uint)iOutput];
  pAVar2 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
  pAVar1 = Abc_AigConst1(pNtk);
  if (pAVar2 == pAVar1) {
    if ((*(uint *)&pObj->field_0x14 >> 10 & 1 ^ fUseConst1) != 1) {
      *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 ^ 0x400;
    }
  }
  else {
    pAVar2 = Abc_AigConst1(pNtk);
    uVar3 = (ulong)(fUseConst1 == 0) ^ (ulong)pAVar2;
    Abc_ObjPatchFanin(pObj,(Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray],
                      (Abc_Obj_t *)(*(uint *)&pObj->field_0x14 >> 10 & 1 ^ uVar3));
    if (((ulong)(*(uint *)&pObj->field_0x14 >> 10 & 1) ^
        (ulong)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray]) != uVar3) {
      __assert_fail("Abc_ObjChild0(pObj) == pConst0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcNtk.c"
                    ,0x731,"void Abc_NtkDropOneOutput(Abc_Ntk_t *, int, int, int)");
    }
    if (fSkipSweep == 0) {
      Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
      return;
    }
  }
  return;
}

Assistant:

void Abc_NtkDropOneOutput( Abc_Ntk_t * pNtk, int iOutput, int fSkipSweep, int fUseConst1 )
{
    Abc_Obj_t * pObj, * pConst0, * pFaninNew;
    pObj = Abc_NtkPo( pNtk, iOutput );
    if ( Abc_ObjFanin0(pObj) == Abc_AigConst1(pNtk) )
    {
        if ( !Abc_ObjFaninC0(pObj) ^ fUseConst1 )
            Abc_ObjXorFaninC( pObj, 0 );
        return;
    }
    pConst0 = Abc_ObjNotCond( Abc_AigConst1(pNtk), !fUseConst1 );
    pFaninNew = Abc_ObjNotCond( pConst0, Abc_ObjFaninC0(pObj) );
    Abc_ObjPatchFanin( pObj, Abc_ObjFanin0(pObj), pFaninNew );
    assert( Abc_ObjChild0(pObj) == pConst0 );
    if ( fSkipSweep )
        return;
    Abc_AigCleanup( (Abc_Aig_t *)pNtk->pManFunc );
}